

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemImpl.cpp
# Opt level: O0

Uint64 efsw::Platform::System::getMaxFD(void)

{
  undefined1 local_18 [8];
  rlimit limit;
  
  if (getMaxFD::max_fd == 0) {
    getrlimit(RLIMIT_NOFILE,(rlimit *)local_18);
    getMaxFD::max_fd = (rlim_t)local_18;
  }
  return getMaxFD::max_fd;
}

Assistant:

Uint64 System::getMaxFD() {
	static rlim_t max_fd = 0;

	if ( max_fd == 0 ) {
		struct rlimit limit;
		getrlimit( RLIMIT_NOFILE, &limit );
		max_fd = limit.rlim_cur;
	}

	return max_fd;
}